

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  SESSION_HANDLE pSVar1;
  int iVar2;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE pSVar3;
  IO_INTERFACE_DESCRIPTION *pIVar4;
  XIO_HANDLE xio;
  CONNECTION_HANDLE connection;
  SESSION_HANDLE pSVar5;
  STRING_HANDLE handle;
  STRING_HANDLE handle_00;
  STRING_HANDLE keyName;
  time_t tVar6;
  CBS_HANDLE pCVar7;
  char *token;
  AMQP_VALUE source;
  AMQP_VALUE target;
  LINK_HANDLE link;
  MESSAGE_HANDLE message;
  MESSAGE_SENDER_HANDLE message_sender;
  int iVar8;
  undefined8 uVar9;
  CBS_HANDLE pCVar10;
  BINARY_DATA amqp_data;
  uchar hello [5];
  SASLCLIENTIO_CONFIG sasl_io_config;
  WSIO_CONFIG ws_io_config;
  undefined4 local_d8;
  undefined1 local_d4;
  CBS_HANDLE local_d0;
  STRING_HANDLE local_c8;
  SESSION_HANDLE local_c0;
  undefined8 local_b8;
  XIO_HANDLE local_b0;
  XIO_HANDLE local_a8;
  SASL_MECHANISM_HANDLE local_a0;
  XIO_HANDLE local_98;
  SASL_MECHANISM_HANDLE local_90;
  char *local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  IO_INTERFACE_DESCRIPTION *local_60;
  char **local_58;
  char *local_50;
  undefined4 local_48;
  char *local_40;
  char *local_38;
  
  iVar2 = platform_init();
  iVar8 = -1;
  if (iVar2 == 0) {
    sasl_mechanism_interface_description = saslmssbcbs_get_interface();
    uVar9 = 0;
    pSVar3 = saslmechanism_create(sasl_mechanism_interface_description,(void *)0x0);
    local_d4 = 0x6f;
    local_d8 = 0x6c6c6568;
    local_88 = "<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>";
    local_80 = 0x1bb;
    local_78 = 0;
    uStack_70 = 0;
    local_50 = "<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>";
    local_48 = 0x1bb;
    local_38 = "AMQPWSB10";
    local_40 = "/$iothub/websocket";
    local_60 = platform_get_default_tlsio();
    local_58 = &local_88;
    pIVar4 = wsio_get_interface_description();
    xio = xio_create(pIVar4,&local_60);
    xio_setoption(xio,"TrustedCerts",
                  "-----BEGIN CERTIFICATE-----\r\nMIIDdzCCAl+gAwIBAgIEAgAAuTANBgkqhkiG9w0BAQUFADBaMQswCQYDVQQGEwJJ\r\nRTESMBAGA1UEChMJQmFsdGltb3JlMRMwEQYDVQQLEwpDeWJlclRydXN0MSIwIAYD\r\nVQQDExlCYWx0aW1vcmUgQ3liZXJUcnVzdCBSb290MB4XDTAwMDUxMjE4NDYwMFoX\r\nDTI1MDUxMjIzNTkwMFowWjELMAkGA1UEBhMCSUUxEjAQBgNVBAoTCUJhbHRpbW9y\r\nZTETMBEGA1UECxMKQ3liZXJUcnVzdDEiMCAGA1UEAxMZQmFsdGltb3JlIEN5YmVy\r\nVHJ1c3QgUm9vdDCCASIwDQYJKoZIhvcNAQEBBQADggEPADCCAQoCggEBAKMEuyKr\r\nmD1X6CZymrV51Cni4eiVgLGw41uOKymaZN+hXe2wCQVt2yguzmKiYv60iNoS6zjr\r\nIZ3AQSsBUnuId9Mcj8e6uYi1agnnc+gRQKfRzMpijS3ljwumUNKoUMMo6vWrJYeK\r\nmpYcqWe4PwzV9/lSEy/CG9VwcPCPwBLKBsua4dnKM3p31vjsufFoREJIE9LAwqSu\r\nXmD+tqYF/LTdB1kC1FkYmGP1pWPgkAx9XbIGevOF6uvUA65ehD5f/xXtabz5OTZy\r\ndc93Uk3zyZAsuT3lySNTPx8kmCFcB5kpvcY67Oduhjprl3RjM71oGDHweI12v/ye\r\njl0qhqdNkNwnGjkCAwEAAaNFMEMwHQYDVR0OBBYEFOWdWTCCR1jMrPoIVDaGezq1\r\nBE3wMBIGA1UdEwEB/wQIMAYBAf8CAQMwDgYDVR0PAQH/BAQDAgEGMA0GCSqGSIb3\r\nDQEBBQUAA4IBAQCFDF2O5G9RaEIFoN27TyclhAO992T9Ldcw46QQF+vaKSm2eT92\r\n9hkTI7gQCvlYpNRhcL0EYWoSihfVCr3FvDB81ukMJY2GQE/szKN+OMY3EU/t3Wgx\r\njkzSswF07r51XgdIGn9w/xZchMB5hbgF/X++ZRGjD8ACtPhSNzkE1akxehi/oCr0\r\nEpn3o0WC4zxe9Z2etciefC7IpJ5OCBRLbf1wbWsaY71k5h+3zvDyny67G7fyUIhz\r\nksLi4xaNmjICq44Y3ekQEe5+NauQrz4wlHrQMz2nZQ/1/I6eYs9HRCwBXbsdtTLS\r\nR9I4LtD+gdwyah617jzV/OeBHRnDJELqYzmp\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIIDjjCCAnagAwIBAgIQAzrx5qcRqaC7KGSxHQn65TANBgkqhkiG9w0BAQsFADBh\r\nMQswCQYDVQQGEwJVUzEVMBMGA1UEChMMRGlnaUNlcnQgSW5jMRkwFwYDVQQLExB3\r\nd3cuZGlnaWNlcnQuY29tMSAwHgYDVQQDExdEaWdpQ2VydCBHbG9iYWwgUm9vdCBH\r\nMjAeFw0xMzA4MDExMjAwMDBaFw0zODAxMTUxMjAwMDBaMGExCzAJBgNVBAYTAlVT\r\nMRUwEwYDVQQKEwxEaWdpQ2VydCBJbmMxGTAXBgNVBAsTEHd3dy5kaWdpY2VydC5j\r\nb20xIDAeBgNVBAMTF0RpZ2lDZXJ0IEdsb2JhbCBSb290IEcyMIIBIjANBgkqhkiG\r\n9w0BAQEFAAOCAQ8AMIIBCgKCAQEAuzfNNNx7a8myaJCtSnX/RrohCgiN9RlUyfuI\r\n2/Ou8jqJkTx65qsGGmvPrC3oXgkkRLpimn7Wo6h+4FR1IAWsULecYxpsMNzaHxmx\r\n1x7e/dfgy5SDN67sH0NO3Xss0r0upS/kqbitOtSZpLYl6ZtrAGCSYP9PIUkY92eQ\r\nq2EGnI/yuum06ZIya7XzV+hdG82MHauVBJVJ8zUtluNJbd134/tJS7SsVQepj5Wz\r\ntCO7TG1F8PapspUwtP1MVYwnSlcUfIKdzXOS0xZKBgyMUNGPHgm+F6HmIcr9g+UQ\r\nvIOlCsRnKPZ..." /* TRUNCATED STRING LITERAL */
                 );
    local_a8 = xio;
    local_a0 = pSVar3;
    local_98 = xio;
    local_90 = pSVar3;
    pIVar4 = saslclientio_get_interface_description();
    local_b0 = xio_create(pIVar4,&local_98);
    connection = connection_create(local_b0,
                                   "<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>"
                                   ,"some",(ON_NEW_ENDPOINT)0x0,(void *)0x0);
    connection_set_trace(connection,true);
    pSVar5 = session_create(connection,(ON_LINK_ATTACHED)0x0,(void *)0x0);
    session_set_incoming_window(pSVar5,0x7fffffff);
    session_set_outgoing_window(pSVar5,0x10000);
    handle = STRING_new();
    STRING_concat(handle,"<<<Replace with your own device key>>>");
    handle_00 = STRING_new();
    STRING_concat(handle_00,
                  "<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>/devices/<<<Replace with your device Id (like test_Device)>>>"
                 );
    keyName = STRING_new();
    tVar6 = time((time_t *)0x0);
    local_c8 = SASToken_Create(handle,handle_00,keyName,tVar6 + 0xe10);
    STRING_delete(handle);
    STRING_delete(handle_00);
    STRING_delete(keyName);
    pCVar7 = cbs_create(pSVar5);
    iVar2 = cbs_open_async(pCVar7,on_cbs_open_complete,pCVar7,on_cbs_error,pCVar7);
    if (iVar2 == 0) {
      token = STRING_c_str(local_c8);
      cbs_put_token_async(pCVar7,"servicebus.windows.net:sastoken",
                          "<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>/devices/<<<Replace with your device Id (like test_Device)>>>"
                          ,token,on_cbs_put_token_complete,pCVar7);
      if (auth == '\0') {
        connection_dowork(connection);
        printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
        uVar9 = 1;
        if (auth == '\0') {
          do {
            connection_dowork(connection);
          } while (auth != '\x01');
        }
      }
      else {
        uVar9 = 0;
      }
    }
    local_d0 = pCVar7;
    local_b8 = uVar9;
    source = messaging_create_source("ingress");
    target = messaging_create_target
                       (
                       "amqps://<<<Replace with your own IoTHub host (like myiothub.azure-devices.net)>>>/devices/<<<Replace with your device Id (like test_Device)>>>/messages/events"
                       );
    link = link_create(pSVar5,"sender-link",false,source,target);
    link_set_max_message_size(link,0x10000);
    amqpvalue_destroy(source);
    amqpvalue_destroy(target);
    message = message_create();
    amqp_data.length = 5;
    amqp_data.bytes = (uchar *)&local_d8;
    message_add_body_amqp_data(message,amqp_data);
    message_sender = messagesender_create(link,(ON_MESSAGE_SENDER_STATE_CHANGED)0x0,(void *)0x0);
    iVar2 = messagesender_open(message_sender);
    if (iVar2 == 0) {
      iVar2 = 1000;
      local_c0 = pSVar5;
      do {
        messagesender_send_async(message_sender,message,on_message_send_complete,message,0);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      message_destroy(message);
      connection_dowork(connection);
      pCVar7 = local_d0;
      pSVar1 = local_c0;
      if ((char)local_b8 == '\0') {
        printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
        pCVar7 = local_d0;
        pSVar1 = local_c0;
      }
      while (pSVar5 = local_c0, pCVar10 = local_d0, local_d0 = pCVar7, local_c0 = pSVar1,
            sent_messages != 1000) {
        connection_dowork(connection);
        pCVar7 = local_d0;
        pSVar1 = local_c0;
        local_c0 = pSVar5;
        local_d0 = pCVar10;
      }
    }
    else {
      message_destroy(message);
      pCVar10 = local_d0;
    }
    STRING_delete(local_c8);
    messagesender_destroy(message_sender);
    cbs_destroy(pCVar10);
    link_destroy(link);
    session_destroy(pSVar5);
    connection_destroy(connection);
    xio_destroy(local_b0);
    xio_destroy(local_a8);
    saslmechanism_destroy(local_a0);
    platform_deinit();
    iVar8 = 0;
    printf("Max memory usage:%lu\r\n",0xffffffffffffffff);
    printf("Current memory usage:%lu\r\n",0xffffffffffffffff);
  }
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc;
    (void)argv;

    if (platform_init() != 0)
    {
        result = -1;
    }
    else
    {
        XIO_HANDLE sasl_io;
        CONNECTION_HANDLE connection;
        SESSION_HANDLE session;
        LINK_HANDLE link;
        MESSAGE_SENDER_HANDLE message_sender;
        MESSAGE_HANDLE message;
        SASLCLIENTIO_CONFIG sasl_io_config;
        STRING_HANDLE keyname_string;

        size_t last_memory_used = 0;

        /* create SASL MSSBCBS handler */
        SASL_MECHANISM_HANDLE sasl_mechanism_handle = saslmechanism_create(saslmssbcbs_get_interface(), NULL);
        XIO_HANDLE ws_io;
        WSIO_CONFIG ws_io_config;
        TLSIO_CONFIG tls_io_config;
        const IO_INTERFACE_DESCRIPTION* tlsio_interface;
        STRING_HANDLE key_string;
        STRING_HANDLE scope_string;
        STRING_HANDLE sas_token;
        CBS_HANDLE cbs;
        AMQP_VALUE source;
        AMQP_VALUE target;
        unsigned char hello[5] = { 'h', 'e', 'l', 'l', 'o' };
        BINARY_DATA binary_data;

        gballoc_init();

        tls_io_config.hostname = IOT_HUB_HOST;
        tls_io_config.port = 443;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;

        /* create the TLS IO */
        ws_io_config.hostname = IOT_HUB_HOST;
        ws_io_config.port = 443;
        ws_io_config.protocol = "AMQPWSB10";
        ws_io_config.resource_name = "/$iothub/websocket";
        ws_io_config.underlying_io_interface = platform_get_default_tlsio();
        ws_io_config.underlying_io_parameters = &tls_io_config;

        tlsio_interface = wsio_get_interface_description();
        ws_io = xio_create(tlsio_interface, &ws_io_config);

        /* the websockets library uses OpenSSL and on Windows the certs need to be pushed down */
        (void)xio_setoption(ws_io, "TrustedCerts", iothub_certs);

        /* create the SASL IO using the WS IO */
        sasl_io_config.underlying_io = ws_io;
        sasl_io_config.sasl_mechanism = sasl_mechanism_handle;

        sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_io_config);

        /* create the connection, session and link */
        connection = connection_create(sasl_io, IOT_HUB_HOST, "some", NULL, NULL);
        connection_set_trace(connection, true);
        session = session_create(connection, NULL, NULL);
        session_set_incoming_window(session, 2147483647);
        session_set_outgoing_window(session, 65536);

        key_string = STRING_new();
        STRING_concat(key_string, IOT_HUB_DEVICE_KEY);
        scope_string = STRING_new();
        STRING_concat(scope_string, IOT_HUB_HOST "/devices/" IOT_HUB_DEVICE_NAME);
        keyname_string = STRING_new();

        sas_token = SASToken_Create(key_string, scope_string, keyname_string, (size_t)time(NULL) + 3600);

        STRING_delete(key_string);
        STRING_delete(scope_string);
        STRING_delete(keyname_string);

        cbs = cbs_create(session);
        if (cbs_open_async(cbs, on_cbs_open_complete, cbs, on_cbs_error, cbs) == 0)
        {
            (void)cbs_put_token_async(cbs, "servicebus.windows.net:sastoken", IOT_HUB_HOST "/devices/" IOT_HUB_DEVICE_NAME, STRING_c_str(sas_token), on_cbs_put_token_complete, cbs);

            while (!auth)
            {
                size_t current_memory_used;
                size_t maximum_memory_used;
                connection_dowork(connection);

                current_memory_used = gballoc_getCurrentMemoryUsed();
                maximum_memory_used = gballoc_getMaximumMemoryUsed();

                if (current_memory_used != last_memory_used)
                {
                    printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                    last_memory_used = current_memory_used;
                }
            }
        }

        source = messaging_create_source("ingress");
        target = messaging_create_target("amqps://" IOT_HUB_HOST "/devices/" IOT_HUB_DEVICE_NAME "/messages/events");
        link = link_create(session, "sender-link", role_sender, source, target);
        (void)link_set_max_message_size(link, 65536);

        amqpvalue_destroy(source);
        amqpvalue_destroy(target);

        message = message_create();

        binary_data.bytes = hello;
        binary_data.length = sizeof(hello);
        message_add_body_amqp_data(message, binary_data);

        /* create a message sender */
        message_sender = messagesender_create(link, NULL, NULL);
        if (messagesender_open(message_sender) == 0)
        {
            uint32_t i;
            bool keep_running = true;

            for (i = 0; i < msg_count; i++)
            {
                (void)messagesender_send_async(message_sender, message, on_message_send_complete, message, 0);
            }

            message_destroy(message);

            while (keep_running)
            {
                size_t current_memory_used;
                size_t maximum_memory_used;
                connection_dowork(connection);

                current_memory_used = gballoc_getCurrentMemoryUsed();
                maximum_memory_used = gballoc_getMaximumMemoryUsed();

                if (current_memory_used != last_memory_used)
                {
                    printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                    last_memory_used = current_memory_used;
                }

                if (sent_messages == msg_count)
                {
                    break;
                }
            }
        }
        else
        {
            message_destroy(message);
        }

        STRING_delete(sas_token);

        messagesender_destroy(message_sender);
        cbs_destroy(cbs);
        link_destroy(link);
        session_destroy(session);
        connection_destroy(connection);
        xio_destroy(sasl_io);
        xio_destroy(ws_io);
        saslmechanism_destroy(sasl_mechanism_handle);
        platform_deinit();

        printf("Max memory usage:%lu\r\n", (unsigned long)gballoc_getCurrentMemoryUsed());
        printf("Current memory usage:%lu\r\n", (unsigned long)gballoc_getMaximumMemoryUsed());

        gballoc_deinit();

        result = 0;
    }

    return result;
}